

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceBlock
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  text._M_str = "{";
  text._M_len = 1;
  bVar1 = ConsumeEndOfDeclaration(this,text,service_location);
  if (bVar1) {
    text_00._M_str = "}";
    text_00._M_len = 1;
    bVar2 = TryConsumeEndOfDeclaration(this,text_00,(LocationRecorder *)0x0);
    bVar1 = true;
    while (!bVar2) {
      if ((this->input_->current_).type == TYPE_END) {
        RecordError(this,(ErrorMaker)ZEXT816(0x65d484));
        return false;
      }
      bVar2 = ParseServiceStatement(this,service,service_location,containing_file);
      if (!bVar2) {
        SkipStatement(this);
      }
      text_01._M_str = "}";
      text_01._M_len = 1;
      bVar2 = TryConsumeEndOfDeclaration(this,text_01,(LocationRecorder *)0x0);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseServiceBlock(ServiceDescriptorProto* service,
                               const LocationRecorder& service_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &service_location));

  while (!TryConsumeEndOfDeclaration("}", nullptr)) {
    if (AtEnd()) {
      RecordError("Reached end of input in service definition (missing '}').");
      return false;
    }

    if (!ParseServiceStatement(service, service_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}